

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugHookIdInfo(ImGuiID id,ImGuiDataType data_type,void *data_id,void *data_id_end)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiStackLevelInfo *pIVar4;
  ImGuiContext *pIVar5;
  ulong uVar6;
  ImGuiStackLevelInfo *__dest;
  long lVar7;
  size_t sVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  ImGuiContext *ctx;
  
  pIVar5 = GImGui;
  uVar11 = (ulong)id;
  pIVar3 = GImGui->CurrentWindow;
  uVar12 = (GImGui->DebugStackTool).StackLevel;
  uVar6 = (ulong)uVar12;
  if (uVar6 == 0xffffffff) {
    (GImGui->DebugStackTool).StackLevel = 0;
    iVar2 = (pIVar3->IDStack).Size;
    iVar14 = (pIVar5->DebugStackTool).Results.Capacity;
    iVar13 = (int)((long)iVar2 + 1);
    if (iVar14 <= iVar2) {
      if (iVar14 == 0) {
        iVar14 = 8;
      }
      else {
        iVar14 = iVar14 / 2 + iVar14;
      }
      if (iVar14 <= iVar13) {
        iVar14 = iVar13;
      }
      piVar1 = &(pIVar5->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
      __dest = (ImGuiStackLevelInfo *)
               (*GImAllocatorAllocFunc)((long)iVar14 << 6,GImAllocatorUserData);
      pIVar4 = (pIVar5->DebugStackTool).Results.Data;
      if (pIVar4 != (ImGuiStackLevelInfo *)0x0) {
        memcpy(__dest,pIVar4,(long)(pIVar5->DebugStackTool).Results.Size << 6);
        pIVar4 = (pIVar5->DebugStackTool).Results.Data;
        if ((pIVar4 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (pIVar5->DebugStackTool).Results.Data = __dest;
      (pIVar5->DebugStackTool).Results.Capacity = iVar14;
    }
    iVar14 = (pIVar5->DebugStackTool).Results.Size;
    if (iVar14 <= iVar2) {
      lVar9 = ((long)iVar2 + 1) - (long)iVar14;
      lVar7 = (long)iVar14 << 6;
      do {
        pIVar4 = (pIVar5->DebugStackTool).Results.Data;
        pcVar10 = pIVar4->Desc + lVar7 + 0x2a;
        pcVar10[0] = '\0';
        pcVar10[1] = '\0';
        pcVar10[2] = '\0';
        pcVar10[3] = '\0';
        pcVar10[4] = '\0';
        pcVar10[5] = '\0';
        pcVar10[6] = '\0';
        pcVar10[7] = '\0';
        pcVar10[8] = '\0';
        pcVar10[9] = '\0';
        pcVar10[10] = '\0';
        pcVar10[0xb] = '\0';
        pcVar10[0xc] = '\0';
        pcVar10[0xd] = '\0';
        pcVar10[0xe] = '\0';
        pcVar10[0xf] = '\0';
        pcVar10 = pIVar4->Desc + lVar7 + 0x1a;
        pcVar10[0] = '\0';
        pcVar10[1] = '\0';
        pcVar10[2] = '\0';
        pcVar10[3] = '\0';
        pcVar10[4] = '\0';
        pcVar10[5] = '\0';
        pcVar10[6] = '\0';
        pcVar10[7] = '\0';
        pcVar10[8] = '\0';
        pcVar10[9] = '\0';
        pcVar10[10] = '\0';
        pcVar10[0xb] = '\0';
        pcVar10[0xc] = '\0';
        pcVar10[0xd] = '\0';
        pcVar10[0xe] = '\0';
        pcVar10[0xf] = '\0';
        pcVar10 = pIVar4->Desc + lVar7 + 10;
        pcVar10[0] = '\0';
        pcVar10[1] = '\0';
        pcVar10[2] = '\0';
        pcVar10[3] = '\0';
        pcVar10[4] = '\0';
        pcVar10[5] = '\0';
        pcVar10[6] = '\0';
        pcVar10[7] = '\0';
        pcVar10[8] = '\0';
        pcVar10[9] = '\0';
        pcVar10[10] = '\0';
        pcVar10[0xb] = '\0';
        pcVar10[0xc] = '\0';
        pcVar10[0xd] = '\0';
        pcVar10[0xe] = '\0';
        pcVar10[0xf] = '\0';
        pcVar10 = pIVar4->Desc + lVar7 + -6;
        pcVar10[0] = '\0';
        pcVar10[1] = '\0';
        pcVar10[2] = '\0';
        pcVar10[3] = '\0';
        pcVar10[4] = '\0';
        pcVar10[5] = '\0';
        pcVar10[6] = '\0';
        pcVar10[7] = '\0';
        pcVar10[8] = '\0';
        pcVar10[9] = '\0';
        pcVar10[10] = '\0';
        pcVar10[0xb] = '\0';
        pcVar10[0xc] = '\0';
        pcVar10[0xd] = '\0';
        pcVar10[0xe] = '\0';
        pcVar10[0xf] = '\0';
        lVar7 = lVar7 + 0x40;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    (pIVar5->DebugStackTool).Results.Size = iVar13;
    iVar2 = (pIVar3->IDStack).Size;
    if ((long)iVar2 < 0) {
      return;
    }
    uVar11 = 0;
    while( true ) {
      uVar12 = id;
      if (uVar11 < (ulong)(long)iVar2) {
        uVar12 = (pIVar3->IDStack).Data[uVar11];
      }
      if ((long)(pIVar5->DebugStackTool).Results.Size <= (long)uVar11) break;
      (pIVar5->DebugStackTool).Results.Data[uVar11].ID = uVar12;
      uVar11 = uVar11 + 1;
      if (uVar11 == iVar2 + 1) {
        return;
      }
    }
LAB_00124f69:
    __assert_fail("i >= 0 && i < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                  ,0x706,
                  "T &ImVector<ImGuiStackLevelInfo>::operator[](int) [T = ImGuiStackLevelInfo]");
  }
  if ((int)uVar12 < 0) {
    __assert_fail("tool->StackLevel >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x4519,
                  "void ImGui::DebugHookIdInfo(ImGuiID, ImGuiDataType, const void *, const void *)")
    ;
  }
  if (uVar12 != (pIVar3->IDStack).Size) {
    return;
  }
  if ((GImGui->DebugStackTool).Results.Size <= (int)uVar12) goto LAB_00124f69;
  pIVar4 = (GImGui->DebugStackTool).Results.Data;
  if ((pIVar4[uVar6].ID != id) || (pIVar4[uVar6].QueryFrameCount < '\x01')) {
    __assert_fail("info->ID == id && info->QueryFrameCount > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x451d,
                  "void ImGui::DebugHookIdInfo(ImGuiID, ImGuiDataType, const void *, const void *)")
    ;
  }
  switch(data_type) {
  case 4:
    pcVar10 = "%d";
    uVar11 = (ulong)data_id & 0xffffffff;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x4531,
                  "void ImGui::DebugHookIdInfo(ImGuiID, ImGuiDataType, const void *, const void *)")
    ;
  case 0xb:
    if (data_id_end == (void *)0x0) {
      sVar8 = strlen((char *)data_id);
    }
    else {
      sVar8 = (long)data_id_end - (long)data_id;
    }
    ImFormatString(pIVar4[uVar6].Desc,0x3a,"\"%.*s\"",sVar8,data_id);
    goto LAB_00124f55;
  case 0xc:
    ImFormatString(pIVar4[uVar6].Desc,0x3a,"(void*)0x%p",data_id);
    goto LAB_00124f55;
  case 0xd:
    if (pIVar4[uVar6].Desc[0] != '\0') goto LAB_00124f55;
    pcVar10 = "0x%08X [override]";
  }
  ImFormatString(pIVar4[uVar6].Desc,0x3a,pcVar10,uVar11);
LAB_00124f55:
  pIVar4[uVar6].QuerySuccess = true;
  return;
}

Assistant:

void ImGui::DebugHookIdInfo(ImGuiID id, ImGuiDataType data_type, const void* data_id, const void* data_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStackTool* tool = &g.DebugStackTool;

    // Step 0: stack query
    // This assume that the ID was computed with the current ID stack, which tends to be the case for our widget.
    if (tool->StackLevel == -1)
    {
        tool->StackLevel++;
        tool->Results.resize(window->IDStack.Size + 1, ImGuiStackLevelInfo());
        for (int n = 0; n < window->IDStack.Size + 1; n++)
            tool->Results[n].ID = (n < window->IDStack.Size) ? window->IDStack[n] : id;
        return;
    }

    // Step 1+: query for individual level
    IM_ASSERT(tool->StackLevel >= 0);
    if (tool->StackLevel != window->IDStack.Size)
        return;
    ImGuiStackLevelInfo* info = &tool->Results[tool->StackLevel];
    IM_ASSERT(info->ID == id && info->QueryFrameCount > 0);

    int data_len;
    switch (data_type)
    {
    case ImGuiDataType_S32:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%d", (int)(intptr_t)data_id);
        break;
    case ImGuiDataType_String:
        data_len = data_id_end ? (int)((const char*)data_id_end - (const char*)data_id) : (int)strlen((const char*)data_id);
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "\"%.*s\"", data_len, (const char*)data_id);
        break;
    case ImGuiDataType_Pointer:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "(void*)0x%p", data_id);
        break;
    case ImGuiDataType_ID:
        if (info->Desc[0] == 0) // PushOverrideID() is often used to avoid hashing twice, which would lead to 2 calls to DebugHookIdInfo(). We prioritize the first one.
            ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "0x%08X [override]", id);
        break;
    default:
        IM_ASSERT(0);
    }
    info->QuerySuccess = true;
}